

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

bool __thiscall miniscript::Node<CPubKey>::CheckStackSize(Node<CPubKey> *this)

{
  byte bVar1;
  byte in_CL;
  long in_FS_OFFSET;
  
  if (this->m_script_ctx == P2WSH) {
    bVar1 = (this->ss).sat.valid;
    if ((bool)bVar1 == true) {
      in_CL = ((this->ss).sat.netdiff + 1) - (uint)(((this->typ).m_flags & 0xd) == 0) < 0x65;
    }
  }
  else {
    if (this->m_script_ctx != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    bVar1 = (this->ss).sat.valid;
    if ((bool)bVar1 == true) {
      in_CL = ((this->ss).sat.exec + 1) - (uint)(((this->typ).m_flags & 0xd) == 0) < 0x3e9;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return (bool)((bVar1 ^ 1 | in_CL) & 1);
}

Assistant:

bool CheckStackSize() const {
        // Since in Tapscript there is no standardness limit on the script and witness sizes, we may run
        // into the maximum stack size while executing the script. Make sure it doesn't happen.
        if (IsTapscript(m_script_ctx)) {
            if (const auto exec_ss = GetExecStackSize()) return exec_ss <= MAX_STACK_SIZE;
            return true;
        }
        if (const auto ss = GetStackSize()) return *ss <= MAX_STANDARD_P2WSH_STACK_ITEMS;
        return true;
    }